

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_lcl.c
# Opt level: O1

void beltBlockAddBitSizeU32(u32 *block,size_t count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar2 = (int)count * 8;
  bVar5 = CARRY4(*block,uVar2);
  *block = *block + uVar2;
  uVar2 = block[1];
  uVar3 = uVar2 + bVar5;
  block[1] = uVar3;
  uVar4 = (uint)(count >> 0x1d);
  if (CARRY4(uVar2,(uint)bVar5)) {
    block[1] = uVar4;
  }
  else {
    bVar5 = CARRY4(uVar3,uVar4);
    block[1] = uVar3 + uVar4;
  }
  uVar3 = (uint)bVar5;
  uVar2 = block[2];
  uVar1 = uVar2 + uVar3;
  block[2] = uVar1;
  uVar4 = (uint)(count >> 0x20);
  if (CARRY4(uVar2,uVar3)) {
    block[2] = uVar4 >> 0x1d;
  }
  else {
    uVar4 = uVar4 >> 0x1d;
    uVar3 = (uint)CARRY4(uVar1,uVar4);
    block[2] = uVar1 + uVar4;
  }
  block[3] = block[3] + uVar3;
  return;
}

Assistant:

void beltBlockAddBitSizeU32(u32 block[4], size_t count)
{
	// block <- block + 8 * count
	register u32 carry = (u32)count << 3;
#if (B_PER_S < 32)
	carry = (block[0] += carry) < carry;
	carry = (block[1] += carry) < carry;
	carry = (block[2] += carry) < carry;
	block[3] += carry;
#else
	register size_t t = count >> 29;
	carry = (block[0] += carry) < carry;
	if ((block[1] += carry) < carry)
		block[1] = (u32)t;
	else
		carry = (block[1] += (u32)t) < (u32)t;
	t >>= 16, t >>= 16;
	if ((block[2] += carry) < carry)
		block[2] = (u32)t;
	else
		carry = (block[2] += (u32)t) < (u32)t;
	t >>= 16, t >>= 16;
	block[3] += carry;
	block[3] += (u32)t;
	t = 0;
#endif
	carry = 0;
}